

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

bool pbrt::RemapPixelCoords(Point2i *pp,Point2i resolution,WrapMode2D wrapMode)

{
  WrapMode WVar1;
  int iVar2;
  int iVar3;
  WrapMode *pWVar4;
  int *piVar5;
  Tuple2<pbrt::Point2,_int> *in_RDI;
  char *in_stack_00000018;
  int in_stack_00000024;
  char *in_stack_00000028;
  LogLevel in_stack_00000034;
  int c;
  Point2i *p;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd4;
  Tuple2<pbrt::Point2,_int> *pTVar6;
  array<pbrt::WrapMode,_2> local_14;
  Tuple2<pbrt::Point2,_int> local_c;
  LogLevel level;
  
  pTVar6 = in_RDI;
  pWVar4 = pstd::array<pbrt::WrapMode,_2>::operator[](&local_14,0);
  level = (LogLevel)((ulong)pTVar6 >> 0x20);
  if (*pWVar4 == OctahedralSphere) {
    pWVar4 = pstd::array<pbrt::WrapMode,_2>::operator[](&local_14,1);
    if (*pWVar4 != OctahedralSphere) {
      LogFatal<char_const(&)[47]>
                (level,(char *)in_RDI,in_stack_ffffffffffffffd4,
                 (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (char (*) [47])CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
    if (*piVar5 < 0) {
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
      iVar3 = -*piVar5;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
      *piVar5 = iVar3;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,1);
      iVar2 = *piVar5 + -1;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
      iVar3 = *piVar5;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
      *piVar5 = iVar2 - iVar3;
    }
    else {
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
      iVar3 = *piVar5;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,0);
      if (*piVar5 <= iVar3) {
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,0);
        iVar3 = *piVar5;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
        iVar2 = *piVar5;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
        *piVar5 = (iVar3 * 2 + -1) - iVar2;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,1);
        iVar3 = *piVar5;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
        iVar3 = (iVar3 + -1) - *piVar5;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
        *piVar5 = iVar3;
      }
    }
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
    if (*piVar5 < 0) {
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,0);
      iVar3 = *piVar5;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
      iVar2 = *piVar5;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
      *piVar5 = (iVar3 + -1) - iVar2;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
      iVar3 = *piVar5;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
      *piVar5 = -iVar3;
    }
    else {
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
      iVar3 = *piVar5;
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,1);
      if (*piVar5 <= iVar3) {
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,0);
        iVar3 = *piVar5;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
        iVar2 = *piVar5;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
        *piVar5 = (iVar3 + -1) - iVar2;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,1);
        iVar3 = *piVar5;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
        iVar2 = *piVar5;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
        *piVar5 = (iVar3 * 2 + -1) - iVar2;
      }
    }
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,0);
    if (*piVar5 == 1) {
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,0);
      *piVar5 = 0;
    }
    piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,1);
    if (*piVar5 == 1) {
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,1);
      *piVar5 = 0;
    }
  }
  else {
    for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
      piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,iVar3);
      if (*piVar5 < 0) {
LAB_004009aa:
        pWVar4 = pstd::array<pbrt::WrapMode,_2>::operator[](&local_14,(long)iVar3);
        WVar1 = *pWVar4;
        if (WVar1 == Repeat) {
          piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,iVar3);
          iVar2 = *piVar5;
          piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,iVar3);
          iVar2 = Mod<int>(iVar2,*piVar5);
          piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,iVar3);
          *piVar5 = iVar2;
        }
        else {
          if (WVar1 == Black) {
            return false;
          }
          if (WVar1 != Clamp) {
            LogFatal(in_stack_00000034,in_stack_00000028,in_stack_00000024,in_stack_00000018);
          }
          piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,iVar3);
          iVar2 = *piVar5;
          piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,iVar3);
          iVar2 = Clamp<int,int,int>(iVar2,0,*piVar5 + -1);
          piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,iVar3);
          *piVar5 = iVar2;
        }
      }
      else {
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](in_RDI,iVar3);
        iVar2 = *piVar5;
        piVar5 = Tuple2<pbrt::Point2,_int>::operator[](&local_c,iVar3);
        if (*piVar5 <= iVar2) goto LAB_004009aa;
      }
    }
  }
  return true;
}

Assistant:

PBRT_CPU_GPU
inline bool RemapPixelCoords(Point2i *pp, Point2i resolution, WrapMode2D wrapMode) {
    Point2i &p = *pp;

    if (wrapMode.wrap[0] == WrapMode::OctahedralSphere) {
        CHECK(wrapMode.wrap[1] == WrapMode::OctahedralSphere);
        if (p[0] < 0) {
            p[0] = -p[0];                     // mirror across u = 0
            p[1] = resolution[1] - 1 - p[1];  // mirror across v = 0.5
        } else if (p[0] >= resolution[0]) {
            p[0] = 2 * resolution[0] - 1 - p[0];  // mirror across u = 1
            p[1] = resolution[1] - 1 - p[1];      // mirror across v = 0.5
        }

        if (p[1] < 0) {
            p[0] = resolution[0] - 1 - p[0];  // mirror across u = 0.5
            p[1] = -p[1];                     // mirror across v = 0;
        } else if (p[1] >= resolution[1]) {
            p[0] = resolution[0] - 1 - p[0];      // mirror across u = 0.5
            p[1] = 2 * resolution[1] - 1 - p[1];  // mirror across v = 1
        }

        // Bleh: things don't go as expected for 1x1 images.
        if (resolution[0] == 1)
            p[0] = 0;
        if (resolution[1] == 1)
            p[1] = 0;

        return true;
    }

    for (int c = 0; c < 2; ++c) {
        if (p[c] >= 0 && p[c] < resolution[c])
            // in bounds
            continue;

        switch (wrapMode.wrap[c]) {
        case WrapMode::Repeat:
            p[c] = Mod(p[c], resolution[c]);
            break;
        case WrapMode::Clamp:
            p[c] = Clamp(p[c], 0, resolution[c] - 1);
            break;
        case WrapMode::Black:
            return false;
        default:
            LOG_FATAL("Unhandled WrapMode mode");
        }
    }
    return true;
}